

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# n2builder.cpp
# Opt level: O3

bool icu_63::anon_unknown_1::equalStrings(UnicodeString *s1,UnicodeString *s2)

{
  ushort uVar1;
  short sVar2;
  UBool UVar3;
  int len;
  int32_t iVar4;
  bool bVar5;
  
  bVar5 = s1 == (UnicodeString *)0x0 && s2 == (UnicodeString *)0x0;
  if (s2 != (UnicodeString *)0x0 && s1 != (UnicodeString *)0x0) {
    uVar1 = (s1->fUnion).fStackFields.fLengthAndFlags;
    if ((uVar1 & 1) == 0) {
      if ((short)uVar1 < 0) {
        len = (s1->fUnion).fFields.fLength;
      }
      else {
        len = (int)(short)uVar1 >> 5;
      }
      sVar2 = (s2->fUnion).fStackFields.fLengthAndFlags;
      if (sVar2 < 0) {
        iVar4 = (s2->fUnion).fFields.fLength;
      }
      else {
        iVar4 = (int)sVar2 >> 5;
      }
      bVar5 = false;
      if ((((int)sVar2 & 1U) == 0) && (len == iVar4)) {
        UVar3 = UnicodeString::doEquals(s1,s2,len);
        return UVar3 != '\0';
      }
    }
    else {
      bVar5 = (bool)(*(byte *)&s2->fUnion & 1);
    }
  }
  return bVar5;
}

Assistant:

bool equalStrings(const UnicodeString *s1, const UnicodeString *s2) {
    if(s1 == nullptr) {
        return s2 == nullptr;
    } else if(s2 == nullptr) {
        return false;
    } else {
        return *s1 == *s2;
    }
}